

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

Map<unsigned_long,_unsigned_long> * __thiscall
google::protobuf::internal::TypeDefinedMapFieldBase<unsigned_long,_unsigned_long>::MutableMap
          (TypeDefinedMapFieldBase<unsigned_long,_unsigned_long> *this)

{
  MapFieldBase::SyncMapWithRepeatedField(&this->super_MapFieldBase);
  MapFieldBase::SetMapDirty(&this->super_MapFieldBase);
  return (Map<unsigned_long,_unsigned_long> *)&this->field_0;
}

Assistant:

Map<Key, T>* MutableMap() {
    SyncMapWithRepeatedField();
    SetMapDirty();
    return &map_;
  }